

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

iterator * __thiscall NNTreeImpl::end(iterator *__return_storage_ptr__,NNTreeImpl *this)

{
  NNTreeImpl *this_local;
  
  NNTreeIterator::NNTreeIterator(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

NNTreeImpl::iterator
NNTreeImpl::end()
{
    return {*this};
}